

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_probe_guess(stb_search *s,int *result)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = s->mode;
  if (iVar3 - 2U < 2) {
    iVar3 = s->maxval;
LAB_0018228c:
    s->guess = iVar3;
  }
  else {
    if (iVar3 == 0) {
      iVar3 = s->minval;
      uVar2 = s->maxval - iVar3;
      if (uVar2 == 0) {
LAB_00182282:
        iVar1 = 0;
        goto LAB_00182297;
      }
      if (uVar2 == 0 || s->maxval < iVar3) {
        __assert_fail("s->minval < s->maxval",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x688,"int stb_probe_guess(stb_search *, int *)");
      }
LAB_00182288:
      iVar3 = (uVar2 >> 1) + iVar3;
      goto LAB_0018228c;
    }
    if (iVar3 == 1) {
      iVar3 = s->minval;
      iVar1 = s->maxval - iVar3;
      if (iVar1 == 0) goto LAB_00182282;
      if (iVar1 == 0 || s->maxval < iVar3) {
        __assert_fail("s->minval < s->maxval",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x67e,"int stb_probe_guess(stb_search *, int *)");
      }
      uVar2 = iVar1 + 1;
      goto LAB_00182288;
    }
  }
  iVar3 = s->guess;
  iVar1 = 1;
LAB_00182297:
  *result = iVar3;
  return iVar1;
}

Assistant:

static int stb_probe_guess(stb_search *s, int *result)
{
   switch(s->mode) {
      case STB_probe_binary_largest:
         if (s->minval == s->maxval) {
            *result = s->minval;
            return 0;
         }
         assert(s->minval < s->maxval);
         // if a < b, then a < p <= b
         s->guess = s->minval + (((unsigned) s->maxval - s->minval + 1) >> 1);
         break;

      case STB_probe_binary_smallest:
         if (s->minval == s->maxval) {
            *result = s->minval;
            return 0;
         }
         assert(s->minval < s->maxval);
         // if a < b, then a <= p < b
         s->guess = s->minval + (((unsigned) s->maxval - s->minval) >> 1);
         break;
      case STB_probe_open_smallest:
      case STB_probe_open_largest:
         s->guess = s->maxval;  // guess the current maxval
         break;
   }
   *result = s->guess;
   return 1;
}